

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v11::detail::to_pointer<char>(basic_appender<char> it,size_t n)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (it.container)->size_ + n;
  if ((it.container)->capacity_ < uVar4) {
    (*(it.container)->grow_)(it.container,uVar4);
  }
  sVar1 = (it.container)->size_;
  uVar4 = n + sVar1;
  if ((it.container)->capacity_ < uVar4) {
    pcVar2 = (char *)0x0;
  }
  else {
    uVar3 = (it.container)->capacity_;
    if (uVar4 < (it.container)->capacity_) {
      uVar3 = uVar4;
    }
    (it.container)->size_ = uVar3;
    pcVar2 = (it.container)->ptr_ + sVar1;
  }
  return pcVar2;
}

Assistant:

FMT_CONSTEXPR20 auto to_pointer(basic_appender<T> it, size_t n) -> T* {
  buffer<T>& buf = get_container(it);
  buf.try_reserve(buf.size() + n);
  auto size = buf.size();
  if (buf.capacity() < size + n) return nullptr;
  buf.try_resize(size + n);
  return buf.data() + size;
}